

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::record_render_pass
          (StateRecorder *this,VkRenderPass render_pass,VkRenderPassCreateInfo *create_info,
          Hash custom_hash)

{
  Impl *this_00;
  bool bVar1;
  WorkItem local_68;
  uint local_44;
  VkRenderPassCreateInfo *local_40;
  VkRenderPassCreateInfo *new_info;
  lock_guard<std::mutex> lock;
  Hash custom_hash_local;
  VkRenderPassCreateInfo *create_info_local;
  VkRenderPass render_pass_local;
  StateRecorder *this_local;
  
  lock._M_device = (mutex_type *)custom_hash;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&new_info,&this->impl->record_lock);
  local_40 = (VkRenderPassCreateInfo *)0x0;
  bVar1 = Impl::copy_render_pass(this->impl,create_info,&this->impl->temp_allocator,&local_40);
  if (bVar1) {
    this_00 = this->impl;
    local_68.type = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
    local_68.handle = api_object_cast<unsigned_long,VkRenderPass_T*>(render_pass);
    local_68.create_info = local_40;
    local_68.custom_hash = (Hash)lock._M_device;
    Impl::push_work_locked(this_00,&local_68);
  }
  else {
    Impl::push_unregister_locked<VkRenderPass_T*>
              (this->impl,VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,render_pass);
    this_local._7_1_ = 0;
  }
  local_44 = (uint)!bVar1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&new_info);
  if (local_44 == 0) {
    Impl::pump_synchronized_recording(this->impl,this);
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StateRecorder::record_render_pass(VkRenderPass render_pass, const VkRenderPassCreateInfo &create_info,
                                       Hash custom_hash)
{
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkRenderPassCreateInfo *new_info = nullptr;
		if (!impl->copy_render_pass(&create_info, impl->temp_allocator, &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO, render_pass);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,
		                        api_object_cast<uint64_t>(render_pass),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}